

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

UnlockStatus __thiscall CategoriesMutex::unlock(CategoriesMutex *this)

{
  int iVar1;
  UnlockStatus UVar2;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->internal_);
  if (this->count_ == 0) {
    UVar2 = ALREADY_UNLOCKED;
  }
  else {
    iVar1 = this->count_ + -1;
    this->count_ = iVar1;
    if (iVar1 == 0) {
      this->current_category_ = -1;
    }
    std::unique_lock<std::mutex>::unlock(&lock);
    std::condition_variable::notify_all();
    UVar2 = UNLOCK_SUCCESS;
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return UVar2;
}

Assistant:

UnlockStatus unlock() {
        std::unique_lock lock(internal_);
        if (count_ == 0) {
            return ALREADY_UNLOCKED;
        }
        --count_;
        if (count_ == 0) {
            current_category_ = -1;
        }

        lock.unlock();
        cv.notify_all();
        return UNLOCK_SUCCESS;
    }